

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamDeviceFactory_p.cpp
# Opt level: O1

IBamIODevice * BamTools::Internal::BamDeviceFactory::CreateDevice(string *source)

{
  int iVar1;
  long lVar2;
  BamFile *this;
  IBamIODevice *this_00;
  BamHttp *this_01;
  BamFtp *this_02;
  
  iVar1 = std::__cxx11::string::compare((char *)source);
  if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)source), iVar1 == 0)) ||
     (iVar1 = std::__cxx11::string::compare((char *)source), iVar1 == 0)) {
    this_00 = (IBamIODevice *)operator_new(0x38);
    BamPipe::BamPipe((BamPipe *)this_00);
    return this_00;
  }
  lVar2 = std::__cxx11::string::find((char *)source,0x1588ee,0);
  if (lVar2 == 0) {
    this_01 = (BamHttp *)operator_new(200);
    BamHttp::BamHttp(this_01,source);
    return &this_01->super_IBamIODevice;
  }
  lVar2 = std::__cxx11::string::find((char *)source,0x1588f6,0);
  if (lVar2 != 0) {
    this = (BamFile *)operator_new(0x58);
    BamFile::BamFile(this,source);
    return (IBamIODevice *)this;
  }
  this_02 = (BamFtp *)operator_new(0x120);
  BamFtp::BamFtp(this_02,source);
  return &this_02->super_IBamIODevice;
}

Assistant:

IBamIODevice* BamDeviceFactory::CreateDevice(const string& source) {

    // check for requested pipe
    if ( source == "-" || source == "stdin" || source == "stdout" )
        return new BamPipe;

    // check for HTTP prefix
    if ( source.find("http://") == 0 )
        return new BamHttp(source);

    // check for FTP prefix
    if ( source.find("ftp://") == 0 )
        return new BamFtp(source);

    // otherwise assume a "normal" file
    return new BamFile(source);
}